

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdout_and_stderr_to_file(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_loop_t *loop;
  uv_timer_t *loop_00;
  int extraout_EDX;
  char *pcVar6;
  char *loop_01;
  void *unaff_RBP;
  int iVar7;
  uv_stream_t *handle;
  uv_process_t *puVar8;
  uv_timer_t *puVar9;
  code *pcVar10;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  uv_os_fd_t uStackY_c64;
  sockaddr_in sStackY_c60;
  uv_stdio_container_t uStackY_c50;
  undefined4 uStackY_c40;
  undefined4 uStackY_c38;
  undefined4 uStackY_c30;
  undefined4 uStackY_c28;
  undefined4 uStackY_c20;
  int iStackY_c18;
  uv_loop_t *puStackY_c10;
  uv_tcp_t uStackY_c08;
  uv_stdio_container_t uStackY_b10;
  undefined4 uStackY_b00;
  undefined4 uStackY_af0;
  undefined4 uStackY_ae0;
  uv_loop_t *puStackY_ad8;
  undefined1 auStackY_ac8 [272];
  anon_union_8_2_26168aa3_for_data aStackY_9b8;
  code *pcStackY_9b0;
  code *pcStackY_9a8;
  void *pvStackY_9a0;
  undefined1 auStackY_998 [40];
  uv_stdio_container_t uStackY_970;
  int iStackY_960;
  uv_handle_type *puStackY_958;
  uv_stream_t uStackY_950;
  uv_handle_type auStackY_848 [114];
  uv_loop_t *puStackY_680;
  uv_fs_t *puStackY_678;
  code *pcStackY_670;
  uv_buf_t uStack_660;
  uv_fs_t uStack_650;
  uv_stdio_container_t uStack_498;
  undefined4 uStack_488;
  uint uStack_480;
  undefined4 uStack_478;
  uint uStack_470;
  uv_loop_t *puStack_460;
  uv_fs_t *puStack_458;
  uv_buf_t uStack_430;
  uv_stdio_container_t uStack_420;
  undefined4 uStack_410;
  uint uStack_408;
  undefined4 uStack_400;
  uint uStack_3f8;
  uv_fs_t uStack_3e8;
  uv_loop_t *puStack_230;
  uv_fs_t *puStack_228;
  uv_buf_t local_208;
  uv_stdio_container_t local_1f8;
  undefined4 local_1e8;
  uint local_1e0;
  undefined4 local_1d8;
  uint local_1d0;
  uv_fs_t local_1c8;
  
  pcVar6 = "stdout_file";
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&local_1c8,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file_cold_9();
LAB_0016a28a:
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_0016a28f:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_0016a294:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_0016a299:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_0016a29e:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_0016a2a3:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_0016a2a8:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
  }
  else {
    pcVar6 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(&local_1c8);
    options.stdio = &local_1f8;
    unaff_R14 = &options;
    local_1f8.flags = UV_IGNORE;
    local_1e8 = 2;
    local_1d8 = 2;
    options.stdio_count = 3;
    local_1e0 = uVar1;
    local_1d0 = uVar1;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016a28a;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016a28f;
    if (exit_cb_called != 1) goto LAB_0016a294;
    if (close_cb_called != 1) goto LAB_0016a299;
    local_208 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&local_1c8,uVar1,&local_208,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0x1b) goto LAB_0016a29e;
    unaff_R14 = (uv_process_options_t *)&local_1c8;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a2a3;
    uv_fs_req_cleanup(&local_1c8);
    printf("output is: %s",output);
    auVar13[0] = -(output[0xc] == 'h');
    auVar13[1] = -(output[0xd] == 'e');
    auVar13[2] = -(output[0xe] == 'l');
    auVar13[3] = -(output[0xf] == 'l');
    auVar13[4] = -(output[0x10] == 'o');
    auVar13[5] = -(output[0x11] == ' ');
    auVar13[6] = -(output[0x12] == 'e');
    auVar13[7] = -(output[0x13] == 'r');
    auVar13[8] = -(output[0x14] == 'r');
    auVar13[9] = -(output[0x15] == 'w');
    auVar13[10] = -(output[0x16] == 'o');
    auVar13[0xb] = -(output[0x17] == 'r');
    auVar13[0xc] = -(output[0x18] == 'l');
    auVar13[0xd] = -(output[0x19] == 'd');
    auVar13[0xe] = -(output[0x1a] == '\n');
    auVar13[0xf] = -(output[0x1b] == '\0');
    auVar11[0] = -(output[0] == 'h');
    auVar11[1] = -(output[1] == 'e');
    auVar11[2] = -(output[2] == 'l');
    auVar11[3] = -(output[3] == 'l');
    auVar11[4] = -(output[4] == 'o');
    auVar11[5] = -(output[5] == ' ');
    auVar11[6] = -(output[6] == 'w');
    auVar11[7] = -(output[7] == 'o');
    auVar11[8] = -(output[8] == 'r');
    auVar11[9] = -(output[9] == 'l');
    auVar11[10] = -(output[10] == 'd');
    auVar11[0xb] = -(output[0xb] == '\n');
    auVar11[0xc] = -(output[0xc] == 'h');
    auVar11[0xd] = -(output[0xd] == 'e');
    auVar11[0xe] = -(output[0xe] == 'l');
    auVar11[0xf] = -(output[0xf] == 'l');
    auVar11 = auVar11 & auVar13;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016a2a8;
    unlink("stdout_file");
    pcVar6 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar6,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar6,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_8();
  loop_01 = "stdout_file";
  puStack_230 = (uv_loop_t *)pcVar6;
  puStack_228 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_3e8,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_0016a4b5:
    run_test_spawn_stdout_and_stderr_to_file2_cold_9();
LAB_0016a4ba:
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_0016a4bf:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_0016a4c4:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_0016a4c9:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_0016a4ce:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_0016a4d3:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_0016a4d8:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
  }
  else {
    loop_01 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(&uStack_3e8);
    unaff_RBP = (void *)0x2;
    uVar1 = dup2(uVar1,2);
    if (uVar1 == 0xffffffff) goto LAB_0016a4b5;
    loop_01 = (char *)(ulong)uVar1;
    options.stdio = &uStack_420;
    unaff_R14 = &options;
    uStack_420.flags = UV_IGNORE;
    uStack_410 = 2;
    uStack_400 = 2;
    options.stdio_count = 3;
    uStack_408 = uVar1;
    uStack_3f8 = uVar1;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016a4ba;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016a4bf;
    if (exit_cb_called != 1) goto LAB_0016a4c4;
    if (close_cb_called != 1) goto LAB_0016a4c9;
    uStack_430 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_3e8,uVar1,&uStack_430,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0x1b) goto LAB_0016a4ce;
    unaff_R14 = (uv_process_options_t *)&uStack_3e8;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a4d3;
    uv_fs_req_cleanup(&uStack_3e8);
    printf("output is: %s",output);
    auVar14[0] = -(output[0xc] == 'h');
    auVar14[1] = -(output[0xd] == 'e');
    auVar14[2] = -(output[0xe] == 'l');
    auVar14[3] = -(output[0xf] == 'l');
    auVar14[4] = -(output[0x10] == 'o');
    auVar14[5] = -(output[0x11] == ' ');
    auVar14[6] = -(output[0x12] == 'e');
    auVar14[7] = -(output[0x13] == 'r');
    auVar14[8] = -(output[0x14] == 'r');
    auVar14[9] = -(output[0x15] == 'w');
    auVar14[10] = -(output[0x16] == 'o');
    auVar14[0xb] = -(output[0x17] == 'r');
    auVar14[0xc] = -(output[0x18] == 'l');
    auVar14[0xd] = -(output[0x19] == 'd');
    auVar14[0xe] = -(output[0x1a] == '\n');
    auVar14[0xf] = -(output[0x1b] == '\0');
    auVar12[0] = -(output[0] == 'h');
    auVar12[1] = -(output[1] == 'e');
    auVar12[2] = -(output[2] == 'l');
    auVar12[3] = -(output[3] == 'l');
    auVar12[4] = -(output[4] == 'o');
    auVar12[5] = -(output[5] == ' ');
    auVar12[6] = -(output[6] == 'w');
    auVar12[7] = -(output[7] == 'o');
    auVar12[8] = -(output[8] == 'r');
    auVar12[9] = -(output[9] == 'l');
    auVar12[10] = -(output[10] == 'd');
    auVar12[0xb] = -(output[0xb] == '\n');
    auVar12[0xc] = -(output[0xc] == 'h');
    auVar12[0xd] = -(output[0xd] == 'e');
    auVar12[0xe] = -(output[0xe] == 'l');
    auVar12[0xf] = -(output[0xf] == 'l');
    auVar12 = auVar12 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016a4d8;
    unlink("stdout_file");
    loop_01 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)loop_01,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  pcVar6 = "stdout_file";
  pcStackY_670 = (code *)0x16a4fe;
  puStack_460 = (uv_loop_t *)loop_01;
  puStack_458 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  pcStackY_670 = (code *)0x16a50a;
  unlink("stderr_file");
  pcStackY_670 = (code *)0x16a51d;
  init_process_options("spawn_helper6",exit_cb);
  pcStackY_670 = (code *)0x16a53a;
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_650,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    pcStackY_670 = (code *)0x16a7e6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_0016a7e6:
    pcStackY_670 = (code *)0x16a7eb;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_0016a7eb:
    pcStackY_670 = (code *)0x16a7f0;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_0016a7f0:
    pcStackY_670 = (code *)0x16a7f5;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_0016a7f5:
    pcStackY_670 = (code *)0x16a7fa;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_0016a7fa:
    pcStackY_670 = (code *)0x16a7ff;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_0016a7ff:
    pcStackY_670 = (code *)0x16a804;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_0016a804:
    pcStackY_670 = (code *)0x16a809;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_0016a809:
    pcStackY_670 = (code *)0x16a80e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_0016a80e:
    pcStackY_670 = (code *)0x16a813;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
LAB_0016a813:
    pcStackY_670 = (code *)0x16a818;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_0016a818:
    pcStackY_670 = (code *)0x16a81d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_0016a81d:
    pcStackY_670 = (code *)0x16a822;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_0016a822:
    pcStackY_670 = (code *)0x16a827;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  else {
    pcVar6 = (char *)(ulong)uVar1;
    pcStackY_670 = (code *)0x16a54f;
    uv_fs_req_cleanup(&uStack_650);
    pcStackY_670 = (code *)0x16a55b;
    uVar1 = dup2(uVar1,1);
    if (uVar1 == 0xffffffff) goto LAB_0016a7e6;
    unaff_RBP = (void *)(ulong)uVar1;
    pcStackY_670 = (code *)0x16a587;
    uVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_650,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
    if (uVar3 == 0xffffffff) goto LAB_0016a7eb;
    pcVar6 = (char *)(ulong)uVar3;
    pcStackY_670 = (code *)0x16a59c;
    uv_fs_req_cleanup(&uStack_650);
    unaff_R15._0_4_ = 2;
    unaff_R15._4_4_ = 0;
    pcStackY_670 = (code *)0x16a5ae;
    uVar3 = dup2(uVar3,2);
    if (uVar3 == 0xffffffff) goto LAB_0016a7f0;
    pcVar6 = (char *)(ulong)uVar3;
    options.stdio = &uStack_498;
    unaff_R14 = &options;
    uStack_498.flags = UV_IGNORE;
    uStack_488 = 2;
    uStack_478 = 2;
    options.stdio_count = 3;
    pcStackY_670 = (code *)0x16a5f2;
    uStack_480 = uVar3;
    uStack_470 = uVar1;
    puVar4 = uv_default_loop();
    pcStackY_670 = (code *)0x16a604;
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016a7f5;
    pcStackY_670 = (code *)0x16a611;
    puVar4 = uv_default_loop();
    pcStackY_670 = (code *)0x16a61b;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016a7fa;
    if (exit_cb_called != 1) goto LAB_0016a7ff;
    if (close_cb_called != 1) goto LAB_0016a804;
    pcStackY_670 = (code *)0x16a64e;
    uStack_660 = uv_buf_init(output,0x400);
    pcStackY_670 = (code *)0x16a679;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_650,uVar1,&uStack_660,1,0,(uv_fs_cb)0x0);
    if (iVar2 < 0xf) goto LAB_0016a809;
    unaff_R14 = (uv_process_options_t *)&uStack_650;
    pcStackY_670 = (code *)0x16a68f;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    pcStackY_670 = (code *)0x16a69d;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a80e;
    pcStackY_670 = (code *)0x16a6af;
    uv_fs_req_cleanup(&uStack_650);
    pcStackY_670 = (code *)0x16a6c4;
    printf("output is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa646c726f777272 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7265206f6c6c6568) goto LAB_0016a813;
    pcStackY_670 = (code *)0x16a713;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_650,uVar3,&uStack_660,1,0,(uv_fs_cb)0x0);
    if (iVar2 < 0xc) goto LAB_0016a818;
    unaff_R14 = (uv_process_options_t *)&uStack_650;
    pcStackY_670 = (code *)0x16a729;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    pcStackY_670 = (code *)0x16a737;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar3,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a81d;
    pcStackY_670 = (code *)0x16a749;
    uv_fs_req_cleanup(&uStack_650);
    pcStackY_670 = (code *)0x16a75e;
    printf("output is: %s",output);
    if (CONCAT13(output[0xb],CONCAT12(output[10],CONCAT11(output[9],output[8]))) != 0xa646c72 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_0016a822;
    pcStackY_670 = (code *)0x16a791;
    unlink("stdout_file");
    pcStackY_670 = (code *)0x16a79d;
    unlink("stderr_file");
    pcStackY_670 = (code *)0x16a7a2;
    pcVar6 = (char *)uv_default_loop();
    pcStackY_670 = (code *)0x16a7b6;
    uv_walk((uv_loop_t *)pcVar6,close_walk_cb,(void *)0x0);
    pcStackY_670 = (code *)0x16a7c0;
    uv_run((uv_loop_t *)pcVar6,UV_RUN_DEFAULT);
    pcStackY_670 = (code *)0x16a7c5;
    puVar4 = uv_default_loop();
    pcStackY_670 = (code *)0x16a7cd;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStackY_670 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  loop = (uv_loop_t *)&pvStackY_9a0;
  pvStackY_9a0 = (void *)0x72662d6f6c6c6568;
  auStackY_998._0_7_ = 0x776170732d6d6f;
  auStackY_998[7] = 'n';
  auStackY_998._8_7_ = 0x6e696474735f;
  pcStackY_9a8 = (code *)0x16a865;
  puStackY_680 = (uv_loop_t *)pcVar6;
  puStackY_678 = (uv_fs_t *)unaff_R14;
  pcStackY_670 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStackY_9a8 = (code *)0x16a86a;
  puVar5 = uv_default_loop();
  puVar4 = (uv_loop_t *)&(&uStackY_950)[1].type;
  pcStackY_9a8 = (code *)0x16a87f;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar4,0);
  pcStackY_9a8 = (code *)0x16a884;
  puVar5 = uv_default_loop();
  pcStackY_9a8 = (code *)0x16a896;
  uv_pipe_init(puVar5,(uv_pipe_t *)&uStackY_950,0);
  options.stdio = &uStackY_970;
  uStackY_970.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  iStackY_960 = 0x21;
  options.stdio_count = 2;
  pcStackY_9a8 = (code *)0x16a8cd;
  uStackY_970.data.stream = &uStackY_950;
  puStackY_958 = (uv_handle_type *)puVar4;
  puVar5 = uv_default_loop();
  iVar7 = 0x333640;
  pcStackY_9a8 = (code *)0x16a8df;
  iVar2 = uv_spawn(puVar5,&process,&options);
  if (iVar2 == 0) {
    auStackY_998._32_8_ = (void *)0x17;
    puVar5 = (uv_loop_t *)(auStackY_848 + 0x42);
    handle = &uStackY_950;
    pcStackY_9a8 = (code *)0x16a918;
    auStackY_998._24_8_ = &pvStackY_9a0;
    iVar2 = uv_write((uv_write_t *)puVar5,handle,(uv_buf_t *)(auStackY_998 + 0x18),1,write_cb);
    iVar7 = (int)handle;
    if (iVar2 != 0) goto LAB_0016a9c3;
    iVar7 = 0x169e55;
    puVar5 = (uv_loop_t *)&(&uStackY_950)[1].type;
    pcStackY_9a8 = (code *)0x16a93b;
    iVar2 = uv_read_start((uv_stream_t *)puVar5,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_0016a9c8;
    pcStackY_9a8 = (code *)0x16a948;
    puVar5 = uv_default_loop();
    iVar7 = 0;
    pcStackY_9a8 = (code *)0x16a952;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016a9cd;
    if (exit_cb_called != 1) goto LAB_0016a9d2;
    if (close_cb_called != 3) goto LAB_0016a9d7;
    iVar7 = 0x3336d0;
    pcStackY_9a8 = (code *)0x16a977;
    iVar2 = strcmp((char *)&pvStackY_9a0,output);
    if (iVar2 != 0) goto LAB_0016a9dc;
    pcStackY_9a8 = (code *)0x16a980;
    puVar4 = uv_default_loop();
    pcStackY_9a8 = (code *)0x16a994;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    iVar7 = 0;
    pcStackY_9a8 = (code *)0x16a99e;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_9a8 = (code *)0x16a9a3;
    loop = uv_default_loop();
    pcStackY_9a8 = (code *)0x16a9ab;
    iVar2 = uv_loop_close(loop);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStackY_9a8 = (code *)0x16a9c3;
    run_test_spawn_stdin_cold_1();
LAB_0016a9c3:
    pcStackY_9a8 = (code *)0x16a9c8;
    run_test_spawn_stdin_cold_2();
LAB_0016a9c8:
    pcStackY_9a8 = (code *)0x16a9cd;
    run_test_spawn_stdin_cold_3();
LAB_0016a9cd:
    pcStackY_9a8 = (code *)0x16a9d2;
    run_test_spawn_stdin_cold_4();
LAB_0016a9d2:
    pcStackY_9a8 = (code *)0x16a9d7;
    run_test_spawn_stdin_cold_5();
LAB_0016a9d7:
    loop = puVar5;
    pcStackY_9a8 = (code *)0x16a9dc;
    run_test_spawn_stdin_cold_6();
LAB_0016a9dc:
    pcStackY_9a8 = (code *)0x16a9e1;
    run_test_spawn_stdin_cold_7();
  }
  pcStackY_9a8 = write_cb;
  run_test_spawn_stdin_cold_8();
  if (iVar7 == 0) {
    uv_close((uv_handle_t *)loop->pending_queue[1],close_cb);
    return extraout_EAX;
  }
  pcStackY_9b0 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_c08.queued_fds = (void *)0x16aa1e;
  auStackY_ac8._264_8_ = puVar4;
  aStackY_9b8.stream = &uStackY_950;
  pcStackY_9b0 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_c08.queued_fds = (void *)0x16aa23;
  puVar5 = uv_default_loop();
  puVar4 = (uv_loop_t *)auStackY_ac8;
  uStackY_c08.queued_fds = (void *)0x16aa37;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar4,0);
  uStackY_b10.flags = UV_IGNORE;
  uStackY_b00 = 0;
  uStackY_af0 = 0;
  uStackY_ae0 = 0x21;
  options.stdio_count = 4;
  uStackY_c08.queued_fds = (void *)0x16aa6a;
  options.stdio = &uStackY_b10;
  puStackY_ad8 = puVar4;
  puVar5 = uv_default_loop();
  uStackY_c08.queued_fds = (void *)0x16aa7c;
  iVar2 = uv_spawn(puVar5,&process,&options);
  if (iVar2 == 0) {
    uStackY_c08.queued_fds = (void *)0x16aa9c;
    iVar2 = uv_read_start((uv_stream_t *)auStackY_ac8,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_0016ab58;
    uStackY_c08.queued_fds = (void *)0x16aaa9;
    puVar5 = uv_default_loop();
    uStackY_c08.queued_fds = (void *)0x16aab3;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016ab5d;
    if (exit_cb_called != 1) goto LAB_0016ab62;
    if (close_cb_called != 2) goto LAB_0016ab67;
    uStackY_c08.queued_fds = (void *)0x16aaea;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa216f69647473 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7320687472756f66) goto LAB_0016ab6c;
    uStackY_c08.queued_fds = (void *)0x16ab16;
    puVar4 = uv_default_loop();
    uStackY_c08.queued_fds = (void *)0x16ab2a;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uStackY_c08.queued_fds = (void *)0x16ab34;
    uv_run(puVar4,UV_RUN_DEFAULT);
    uStackY_c08.queued_fds = (void *)0x16ab39;
    puVar5 = uv_default_loop();
    uStackY_c08.queued_fds = (void *)0x16ab41;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    uStackY_c08.queued_fds = (void *)0x16ab58;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0016ab58:
    uStackY_c08.queued_fds = (void *)0x16ab5d;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0016ab5d:
    uStackY_c08.queued_fds = (void *)0x16ab62;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0016ab62:
    uStackY_c08.queued_fds = (void *)0x16ab67;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0016ab67:
    uStackY_c08.queued_fds = (void *)0x16ab6c;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0016ab6c:
    uStackY_c08.queued_fds = (void *)0x16ab71;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_c08.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_c10 = (uv_loop_t *)0x16ab82;
  puVar5 = uv_default_loop();
  puStackY_c10 = (uv_loop_t *)0x16ab8d;
  iVar2 = uv_tcp_init(puVar5,&uStackY_c08);
  if (iVar2 == 0) {
    puStackY_c10 = (uv_loop_t *)0x16ab9e;
    iVar2 = uv_tcp_open(&uStackY_c08,3);
    if (iVar2 != 0) goto LAB_0016abc7;
    puStackY_c10 = (uv_loop_t *)0x16abb1;
    iVar2 = uv_listen((uv_stream_t *)&uStackY_c08,0x1000,(uv_connection_cb)0x0);
    if (iVar2 == 0) {
      return 1;
    }
  }
  else {
    puStackY_c10 = (uv_loop_t *)0x16abc7;
    spawn_tcp_server_helper_cold_1();
LAB_0016abc7:
    puStackY_c10 = (uv_loop_t *)0x16abcc;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_c10 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_c10 = puVar4;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_c60);
  if (iVar2 == 0) {
    uStackY_c64 = -1;
    puVar4 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(puVar4,&tcp_server,2);
    if (iVar2 != 0) goto LAB_0016ad32;
    iVar2 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_c60,0);
    if (iVar2 != 0) goto LAB_0016ad37;
    iVar2 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_c64);
    if (iVar2 != 0) goto LAB_0016ad3c;
    if (uStackY_c64 < 1) goto LAB_0016ad41;
    options.stdio = &uStackY_c50;
    uStackY_c50.flags = UV_INHERIT_FD;
    uStackY_c50.data.fd = 0;
    uStackY_c40 = 2;
    uStackY_c38 = 1;
    uStackY_c30 = 2;
    uStackY_c28 = 2;
    uStackY_c20 = 2;
    iStackY_c18 = uStackY_c64;
    options.stdio_count = 4;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016ad46;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016ad4b;
    if (exit_cb_called != 1) goto LAB_0016ad50;
    if (close_cb_called != 1) goto LAB_0016ad55;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0016ad32:
    run_test_spawn_tcp_server_cold_2();
LAB_0016ad37:
    run_test_spawn_tcp_server_cold_3();
LAB_0016ad3c:
    run_test_spawn_tcp_server_cold_4();
LAB_0016ad41:
    run_test_spawn_tcp_server_cold_5();
LAB_0016ad46:
    run_test_spawn_tcp_server_cold_6();
LAB_0016ad4b:
    run_test_spawn_tcp_server_cold_7();
LAB_0016ad50:
    run_test_spawn_tcp_server_cold_8();
LAB_0016ad55:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  puVar4 = uv_default_loop();
  iVar2 = uv_spawn(puVar4,&process,&options);
  if (iVar2 == 0) {
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016ae0c;
    if (exit_cb_called != 1) goto LAB_0016ae11;
    if (close_cb_called != 1) goto LAB_0016ae16;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016ae0c:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016ae11:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016ae16:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  loop_00 = (uv_timer_t *)uv_default_loop();
  puVar8 = &process;
  iVar2 = uv_spawn((uv_loop_t *)loop_00,&process,&options);
  if (iVar2 == 0) {
    loop_00 = (uv_timer_t *)uv_default_loop();
    puVar9 = &timer;
    iVar2 = uv_timer_init((uv_loop_t *)loop_00,&timer);
    pcVar10 = (code *)puVar9;
    if (iVar2 != 0) goto LAB_0016aef3;
    loop_00 = &timer;
    pcVar10 = timer_cb;
    iVar2 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar2 != 0) goto LAB_0016aef8;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcVar10 = (code *)0x0;
    iVar2 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016aefd;
    if (exit_cb_called != 1) goto LAB_0016af02;
    if (close_cb_called != 2) goto LAB_0016af07;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcVar10 = (code *)0x0;
    uv_run(puVar4,UV_RUN_DEFAULT);
    loop_00 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar10 = (code *)puVar8;
LAB_0016aef3:
    run_test_spawn_and_kill_cold_2();
LAB_0016aef8:
    run_test_spawn_and_kill_cold_3();
LAB_0016aefd:
    run_test_spawn_and_kill_cold_4();
LAB_0016af02:
    run_test_spawn_and_kill_cold_5();
LAB_0016af07:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar6 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar10 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close((uv_handle_t *)loop_00,close_cb);
      pcVar6 = (char *)(ulong)*(uint *)&((uv_loop_t *)loop_00)->watchers;
      iVar2 = uv_kill(*(uint *)&((uv_loop_t *)loop_00)->watchers,0);
      if (iVar2 == -3) {
        return -3;
      }
      goto LAB_0016af66;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016af66:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close((uv_handle_t *)pcVar6,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file) {
  int r;
  uv_file file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);

  file = r;

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT(r == 27);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strcmp("hello world\nhello errworld\n", output) == 0);

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}